

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS ref_phys_normal_spacing(REF_GRID ref_grid,REF_DBL *normalspacing)

{
  int *piVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  ulong uVar5;
  void *__ptr;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  char *pcVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  REF_INT ntri;
  REF_GRID local_150;
  REF_CELL local_148;
  REF_INT tri_list [2];
  REF_DBL edg_norm [3];
  REF_INT edg_nodes [27];
  REF_INT tri_nodes [27];
  
  ref_node = ref_grid->node;
  uVar4 = ref_node->max;
  uVar5 = 0;
  uVar12 = 0;
  if (0 < (int)uVar4) {
    uVar12 = (ulong)uVar4;
  }
  for (; uVar12 != uVar5; uVar5 = uVar5 + 1) {
    if (-1 < ref_node->global[uVar5]) {
      normalspacing[uVar5] = 0.0;
    }
  }
  if ((int)uVar4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x3d4,
           "ref_phys_normal_spacing","malloc hits of REF_INT negative");
LAB_001a0556:
    uVar4 = 1;
  }
  else {
    __ptr = malloc((ulong)uVar4 << 2);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x3d4,
             "ref_phys_normal_spacing","malloc hits of REF_INT NULL");
      uVar4 = 2;
    }
    else {
      for (uVar5 = 0; uVar12 != uVar5; uVar5 = uVar5 + 1) {
        *(undefined4 *)((long)__ptr + uVar5 * 4) = 0;
      }
      if (ref_grid->twod == 0) {
        pcVar10 = "implement 3D";
        uVar4 = 6;
        uVar9 = 0x3f6;
      }
      else {
        ref_cell = ref_grid->cell[0];
        local_148 = ref_grid->cell[3];
        local_150 = ref_grid;
        for (iVar11 = 0; iVar11 < ref_cell->max; iVar11 = iVar11 + 1) {
          RVar3 = ref_cell_nodes(ref_cell,iVar11,edg_nodes);
          if (RVar3 == 0) {
            uVar4 = ref_layer_interior_seg_normal(ref_grid,iVar11,edg_norm);
            if (uVar4 != 0) {
              pcVar10 = "edge norm";
              uVar9 = 0x3df;
              goto LAB_001a06d8;
            }
            uVar4 = ref_cell_list_with2(ref_grid->cell[3],edg_nodes[0],edg_nodes[1],2,&ntri,tri_list
                                       );
            if (uVar4 != 0) {
              pcVar10 = "tri with2";
              uVar9 = 0x3e2;
              goto LAB_001a06d8;
            }
            if ((long)ntri != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x3e3,"ref_phys_normal_spacing","edg expects one tri",1,(long)ntri);
              goto LAB_001a0556;
            }
            uVar4 = ref_cell_nodes(local_148,tri_list[0],tri_nodes);
            if (uVar4 != 0) {
              pcVar10 = "tri nodes";
              uVar9 = 0x3e5;
              goto LAB_001a06d8;
            }
            lVar7 = (long)edg_nodes[0];
            lVar6 = (long)edg_nodes[1];
            pRVar2 = ref_node->real;
            lVar8 = (long)((((tri_nodes[0] - edg_nodes[0]) + tri_nodes[1] + tri_nodes[2]) -
                           edg_nodes[1]) * 0xf);
            dVar13 = (pRVar2[lVar8 + 2] - pRVar2[lVar7 * 0xf + 2]) * edg_norm[2] +
                     (pRVar2[lVar8] - pRVar2[lVar7 * 0xf]) * edg_norm[0] +
                     (pRVar2[lVar8 + 1] - pRVar2[lVar7 * 0xf + 1]) * edg_norm[1];
            normalspacing[lVar7] = normalspacing[lVar7] + dVar13;
            piVar1 = (int *)((long)__ptr + lVar7 * 4);
            *piVar1 = *piVar1 + 1;
            normalspacing[lVar6] = dVar13 + normalspacing[lVar6];
            piVar1 = (int *)((long)__ptr + lVar6 * 4);
            *piVar1 = *piVar1 + 1;
            ref_grid = local_150;
          }
        }
        uVar12 = 0;
        uVar5 = (ulong)(uint)ref_node->max;
        if (ref_node->max < 1) {
          uVar5 = uVar12;
        }
        for (; uVar5 != uVar12; uVar12 = uVar12 + 1) {
          if ((-1 < ref_node->global[uVar12]) &&
             (iVar11 = *(int *)((long)__ptr + uVar12 * 4), 0 < iVar11)) {
            normalspacing[uVar12] = normalspacing[uVar12] / (double)iVar11;
          }
        }
        free(__ptr);
        uVar4 = ref_node_ghost_dbl(ref_node,normalspacing,1);
        if (uVar4 == 0) {
          return 0;
        }
        pcVar10 = "ghost normalspacing";
        uVar9 = 0x3ff;
      }
LAB_001a06d8:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar9,
             "ref_phys_normal_spacing",(ulong)uVar4,pcVar10);
    }
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_phys_normal_spacing(REF_GRID ref_grid,
                                           REF_DBL *normalspacing) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *hits;
  REF_INT node;
  each_ref_node_valid_node(ref_node, node) { normalspacing[node] = 0.0; }
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node;
    REF_DBL dn, dxyz[3], edg_norm[3];
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      dn = ref_math_dot(dxyz, edg_norm);
      normalspacing[edg_nodes[0]] += dn;
      hits[edg_nodes[0]] += 1;
      normalspacing[edg_nodes[1]] += dn;
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }
  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      normalspacing[node] /= (REF_DBL)hits[node];
    }
  }
  ref_free(hits);

  RSS(ref_node_ghost_dbl(ref_node, normalspacing, 1), "ghost normalspacing");

  return REF_SUCCESS;
}